

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.c
# Opt level: O3

LY_ERR ly_path_check_predicate
                 (ly_ctx *ctx,lysc_node *cur_node,lyxp_expr *exp,uint32_t *tok_idx,uint16_t prefix,
                 uint16_t pred)

{
  uint32_t uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  lyd_node *plVar5;
  LY_ERR LVar6;
  LY_ERR LVar7;
  int iVar8;
  lyxp_expr_type *plVar9;
  char *format;
  char *pcVar10;
  ly_set *plVar11;
  undefined6 in_register_00000082;
  ulong uVar12;
  char *pcVar13;
  ly_set *set;
  ly_set *local_40;
  uint local_38;
  uint local_34;
  
  local_38 = (uint)CONCAT62(in_register_00000082,prefix);
  local_40 = (ly_set *)0x0;
  if (cur_node != (lysc_node *)0x0) {
    ly_log_location(cur_node,(lyd_node *)0x0,(char *)0x0,(ly_in *)0x0);
  }
  LVar7 = LY_SUCCESS;
  LVar6 = lyxp_next_token((ly_ctx *)0x0,exp,tok_idx,LYXP_TOKEN_BRACK1);
  if (LVar6 != LY_SUCCESS) goto LAB_001135ee;
  if (pred == 0x100) {
LAB_001134dd:
    LVar7 = lyxp_check_token((ly_ctx *)0x0,exp,*tok_idx,LYXP_TOKEN_NAMETEST);
    if (LVar7 == LY_SUCCESS) {
      LVar7 = ly_set_new(&local_40);
      if (LVar7 == LY_SUCCESS) {
        local_34 = local_38 & 0xffff;
        do {
          LVar7 = lyxp_check_token(ctx,exp,*tok_idx,LYXP_TOKEN_NAMETEST);
          if (LVar7 != LY_SUCCESS) goto LAB_001135e8;
          pcVar10 = strnstr(exp->expr + exp->tok_pos[*tok_idx],":",(ulong)exp->tok_len[*tok_idx]);
          if (((short)local_38 == 0x20) && (pcVar10 == (char *)0x0)) {
            uVar4 = exp->tok_len[*tok_idx];
            pcVar13 = exp->expr + exp->tok_pos[*tok_idx];
            pcVar10 = "Prefix missing for \"%.*s\" in path.";
            goto LAB_00113c5e;
          }
          if ((local_34 == 0x80) && (pcVar10 != (char *)0x0)) {
            uVar4 = exp->tok_len[*tok_idx];
            pcVar13 = exp->expr + exp->tok_pos[*tok_idx];
            pcVar10 = "Redundant prefix for \"%.*s\" in path.";
            goto LAB_00113c5e;
          }
          uVar4 = *tok_idx;
          if (pcVar10 == (char *)0x0) {
            pcVar10 = exp->expr + exp->tok_pos[uVar4];
            pcVar13 = (char *)(ulong)exp->tok_len[uVar4];
          }
          else {
            pcVar10 = pcVar10 + 1;
            pcVar13 = exp->expr +
                      ((ulong)exp->tok_len[uVar4] - (long)pcVar10) + (ulong)exp->tok_pos[uVar4];
          }
          plVar11 = local_40;
          if (local_40->count != 0) {
            uVar12 = 0;
            do {
              plVar5 = (plVar11->field_2).dnodes[uVar12];
              iVar8 = strncmp((char *)plVar5,pcVar10,(size_t)pcVar13);
              if ((iVar8 == 0) &&
                 (LVar7 = lysp_check_identifierchar
                                    ((lysp_ctx *)0x0,(int)pcVar13[(long)&plVar5->hash],'\0',
                                     (uint8_t *)0x0), plVar11 = local_40, LVar7 != LY_SUCCESS))
              goto LAB_00113ba7;
              uVar12 = uVar12 + 1;
            } while (uVar12 < plVar11->count);
          }
          LVar7 = ly_set_add(plVar11,pcVar10,'\x01',(uint32_t *)0x0);
          if (LVar7 != LY_SUCCESS) break;
          *tok_idx = *tok_idx + 1;
          LVar7 = lyxp_next_token(ctx,exp,tok_idx,LYXP_TOKEN_OPER_EQUAL);
          if (LVar7 != LY_SUCCESS) goto LAB_001135e8;
          plVar9 = (lyxp_expr_type *)calloc(2,4);
          uVar1 = *tok_idx;
          exp->repeat[uVar1 - 2] = plVar9;
          if (exp->repeat[uVar1 - 2] == (lyxp_expr_type *)0x0) goto LAB_00113bef;
          *exp->repeat[uVar1 - 2] = LYXP_EXPR_EQUALITY;
          LVar7 = lyxp_next_token((ly_ctx *)0x0,exp,tok_idx,LYXP_TOKEN_LITERAL);
          if (((LVar7 != LY_SUCCESS) &&
              (LVar7 = lyxp_next_token((ly_ctx *)0x0,exp,tok_idx,LYXP_TOKEN_NUMBER),
              LVar7 != LY_SUCCESS)) &&
             (LVar7 = lyxp_next_token((ly_ctx *)0x0,exp,tok_idx,LYXP_TOKEN_VARREF),
             LVar7 != LY_SUCCESS)) {
            lyxp_next_token(ctx,exp,tok_idx,LYXP_TOKEN_LITERAL);
            goto LAB_001135e8;
          }
          LVar7 = lyxp_next_token(ctx,exp,tok_idx,LYXP_TOKEN_BRACK2);
          if (LVar7 != LY_SUCCESS) goto LAB_001135e8;
          LVar7 = LY_SUCCESS;
          LVar6 = lyxp_next_token((ly_ctx *)0x0,exp,tok_idx,LYXP_TOKEN_BRACK1);
        } while (LVar6 == LY_SUCCESS);
      }
      goto LAB_001135ee;
    }
    if (pred != 0x200) goto LAB_0011359b;
    LVar7 = lyxp_next_token((ly_ctx *)0x0,exp,tok_idx,LYXP_TOKEN_DOT);
    if (LVar7 == LY_SUCCESS) {
      LVar7 = lyxp_next_token(ctx,exp,tok_idx,LYXP_TOKEN_OPER_EQUAL);
      if (LVar7 == LY_SUCCESS) {
        plVar9 = (lyxp_expr_type *)calloc(2,4);
        uVar1 = *tok_idx;
        exp->repeat[uVar1 - 2] = plVar9;
        if (exp->repeat[uVar1 - 2] == (lyxp_expr_type *)0x0) {
LAB_00113bef:
          LVar7 = LY_EMEM;
          ly_log((ly_ctx *)0x0,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).",
                 "ly_path_check_predicate");
          goto LAB_001135ee;
        }
        *exp->repeat[uVar1 - 2] = LYXP_EXPR_EQUALITY;
        LVar7 = lyxp_next_token2(ctx,exp,tok_idx,LYXP_TOKEN_LITERAL,LYXP_TOKEN_NUMBER);
        if (LVar7 == LY_SUCCESS) goto LAB_0011356b;
      }
    }
    else {
      LVar7 = lyxp_next_token((ly_ctx *)0x0,exp,tok_idx,LYXP_TOKEN_NUMBER);
      if (LVar7 != LY_SUCCESS) goto LAB_0011359b;
      uVar1 = *tok_idx;
      pcVar13 = exp->expr + exp->tok_pos[uVar1 - 1];
      iVar8 = atoi(pcVar13);
      if (iVar8 == 0) {
        uVar4 = exp->tok_len[uVar1 - 1];
        pcVar10 = "Invalid positional predicate \"%.*s\".";
LAB_00113c5e:
        ly_vlog(ctx,(char *)0x0,LYVE_XPATH,pcVar10,(ulong)uVar4,pcVar13);
      }
      else {
LAB_0011356b:
        LVar7 = lyxp_next_token(ctx,exp,tok_idx,LYXP_TOKEN_BRACK2);
        if (LVar7 == LY_SUCCESS) {
          LVar7 = LY_SUCCESS;
          goto LAB_001135ee;
        }
      }
    }
  }
  else {
    if (pred == 0x400) {
      LVar7 = lyxp_check_token((ly_ctx *)0x0,exp,*tok_idx,LYXP_TOKEN_NAMETEST);
      if (LVar7 == LY_SUCCESS) {
        if ((short)local_38 != 0x10) {
          __assert_fail("prefix == LY_PATH_PREFIX_OPTIONAL",
                        "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/path.c"
                        ,0xa5,
                        "LY_ERR ly_path_check_predicate(const struct ly_ctx *, const struct lysc_node *, const struct lyxp_expr *, uint32_t *, uint16_t, uint16_t)"
                       );
        }
        LVar7 = ly_set_new(&local_40);
        LVar6 = LVar7;
        while (LVar6 == LY_SUCCESS) {
          LVar7 = lyxp_check_token(ctx,exp,*tok_idx,LYXP_TOKEN_NAMETEST);
          if (LVar7 != LY_SUCCESS) goto LAB_001135e8;
          pcVar10 = strnstr(exp->expr + exp->tok_pos[*tok_idx],":",(ulong)exp->tok_len[*tok_idx]);
          uVar4 = *tok_idx;
          if (pcVar10 == (char *)0x0) {
            pcVar10 = exp->expr + exp->tok_pos[uVar4];
            pcVar13 = (char *)(ulong)exp->tok_len[uVar4];
          }
          else {
            pcVar10 = pcVar10 + 1;
            pcVar13 = exp->expr +
                      ((ulong)exp->tok_len[uVar4] - (long)pcVar10) + (ulong)exp->tok_pos[uVar4];
          }
          plVar11 = local_40;
          if (local_40->count != 0) {
            uVar12 = 0;
            do {
              plVar5 = (plVar11->field_2).dnodes[uVar12];
              iVar8 = strncmp((char *)plVar5,pcVar10,(size_t)pcVar13);
              if ((iVar8 == 0) &&
                 (LVar7 = lysp_check_identifierchar
                                    ((lysp_ctx *)0x0,(int)pcVar13[(long)&plVar5->hash],'\0',
                                     (uint8_t *)0x0), plVar11 = local_40, LVar7 != LY_SUCCESS))
              goto LAB_00113ba7;
              uVar12 = uVar12 + 1;
            } while (uVar12 < plVar11->count);
          }
          LVar7 = ly_set_add(plVar11,pcVar10,'\x01',(uint32_t *)0x0);
          if (LVar7 != LY_SUCCESS) break;
          *tok_idx = *tok_idx + 1;
          LVar7 = lyxp_next_token(ctx,exp,tok_idx,LYXP_TOKEN_OPER_EQUAL);
          if (LVar7 != LY_SUCCESS) goto LAB_001135e8;
          plVar9 = (lyxp_expr_type *)calloc(2,4);
          uVar1 = *tok_idx;
          exp->repeat[uVar1 - 2] = plVar9;
          if (exp->repeat[uVar1 - 2] == (lyxp_expr_type *)0x0) goto LAB_00113bef;
          *exp->repeat[uVar1 - 2] = LYXP_EXPR_EQUALITY;
          LVar7 = lyxp_check_token(ctx,exp,*tok_idx,LYXP_TOKEN_FUNCNAME);
          if (LVar7 != LY_SUCCESS) goto LAB_001135e8;
          uVar4 = *tok_idx;
          uVar2 = exp->tok_len[uVar4];
          pcVar10 = exp->expr;
          uVar3 = exp->tok_pos[uVar4];
          if ((uVar2 != 7) || (iVar8 = strncmp(pcVar10 + uVar3,"current",7), iVar8 != 0)) {
            pcVar10 = pcVar10 + uVar3;
            format = "Invalid function \"%.*s\" invocation in path.";
            uVar12 = (ulong)uVar2;
            goto LAB_00113bc0;
          }
          *tok_idx = uVar4 + 1;
          LVar7 = lyxp_next_token(ctx,exp,tok_idx,LYXP_TOKEN_PAR1);
          if ((((LVar7 != LY_SUCCESS) ||
               (LVar7 = lyxp_next_token(ctx,exp,tok_idx,LYXP_TOKEN_PAR2), LVar7 != LY_SUCCESS)) ||
              (LVar7 = lyxp_next_token(ctx,exp,tok_idx,LYXP_TOKEN_OPER_PATH), LVar7 != LY_SUCCESS))
             || (LVar7 = lyxp_next_token(ctx,exp,tok_idx,LYXP_TOKEN_DDOT), LVar7 != LY_SUCCESS))
          goto LAB_001135e8;
          do {
            LVar7 = lyxp_next_token(ctx,exp,tok_idx,LYXP_TOKEN_OPER_PATH);
            if (LVar7 != LY_SUCCESS) goto LAB_001135e8;
            LVar7 = lyxp_next_token((ly_ctx *)0x0,exp,tok_idx,LYXP_TOKEN_DDOT);
          } while (LVar7 == LY_SUCCESS);
          LVar7 = lyxp_next_token(ctx,exp,tok_idx,LYXP_TOKEN_NAMETEST);
          while( true ) {
            if (LVar7 != LY_SUCCESS) goto LAB_001135e8;
            LVar7 = lyxp_next_token((ly_ctx *)0x0,exp,tok_idx,LYXP_TOKEN_OPER_PATH);
            if (LVar7 != LY_SUCCESS) break;
            LVar7 = lyxp_next_token(ctx,exp,tok_idx,LYXP_TOKEN_NAMETEST);
          }
          LVar7 = lyxp_next_token(ctx,exp,tok_idx,LYXP_TOKEN_BRACK2);
          if (LVar7 != LY_SUCCESS) goto LAB_001135e8;
          LVar7 = LY_SUCCESS;
          LVar6 = lyxp_next_token((ly_ctx *)0x0,exp,tok_idx,LYXP_TOKEN_BRACK1);
        }
        goto LAB_001135ee;
      }
    }
    else if (pred == 0x200) goto LAB_001134dd;
LAB_0011359b:
    LVar7 = lyxp_check_token(ctx,exp,*tok_idx,LYXP_TOKEN_NONE);
    if (LVar7 == LY_SUCCESS) {
      pcVar10 = lyxp_token2str(exp->tokens[*tok_idx]);
      ly_vlog(ctx,(char *)0x0,LYVE_XPATH,"Unexpected XPath token \"%s\" (\"%.15s\").",pcVar10,
              exp->expr + exp->tok_pos[*tok_idx]);
    }
  }
LAB_001135e8:
  LVar7 = LY_EVALID;
LAB_001135ee:
  ly_log_location_revert((uint)(cur_node != (lysc_node *)0x0),0,0,0);
  ly_set_free(local_40,(_func_void_void_ptr *)0x0);
  return LVar7;
LAB_00113ba7:
  format = "Duplicate predicate key \"%.*s\" in path.";
  uVar12 = (ulong)pcVar13 & 0xffffffff;
LAB_00113bc0:
  ly_vlog(ctx,(char *)0x0,LYVE_XPATH,format,uVar12,pcVar10);
  goto LAB_001135e8;
}

Assistant:

static LY_ERR
ly_path_check_predicate(const struct ly_ctx *ctx, const struct lysc_node *cur_node, const struct lyxp_expr *exp,
        uint32_t *tok_idx, uint16_t prefix, uint16_t pred)
{
    LY_ERR ret = LY_SUCCESS;
    struct ly_set *set = NULL;
    uint32_t i;
    const char *name;
    size_t name_len;

    if (cur_node) {
        LOG_LOCSET(cur_node, NULL);
    }

    if (!lyxp_next_token(NULL, exp, tok_idx, LYXP_TOKEN_BRACK1)) {
        /* '[' */

        if (((pred == LY_PATH_PRED_SIMPLE) || (pred == LY_PATH_PRED_KEYS)) &&
                !lyxp_check_token(NULL, exp, *tok_idx, LYXP_TOKEN_NAMETEST)) {
            ret = ly_set_new(&set);
            LY_CHECK_GOTO(ret, cleanup);

            do {
                /* NameTest is always expected here */
                LY_CHECK_GOTO(lyxp_check_token(ctx, exp, *tok_idx, LYXP_TOKEN_NAMETEST), token_error);

                /* check prefix based on the options */
                name = strnstr(exp->expr + exp->tok_pos[*tok_idx], ":", exp->tok_len[*tok_idx]);
                if ((prefix == LY_PATH_PREFIX_MANDATORY) && !name) {
                    LOGVAL(ctx, LYVE_XPATH, "Prefix missing for \"%.*s\" in path.", (int)exp->tok_len[*tok_idx],
                            exp->expr + exp->tok_pos[*tok_idx]);
                    goto token_error;
                } else if ((prefix == LY_PATH_PREFIX_STRICT_INHERIT) && name) {
                    LOGVAL(ctx, LYVE_XPATH, "Redundant prefix for \"%.*s\" in path.", (int)exp->tok_len[*tok_idx],
                            exp->expr + exp->tok_pos[*tok_idx]);
                    goto token_error;
                }
                if (!name) {
                    name = exp->expr + exp->tok_pos[*tok_idx];
                    name_len = exp->tok_len[*tok_idx];
                } else {
                    ++name;
                    name_len = exp->tok_len[*tok_idx] - (name - (exp->expr + exp->tok_pos[*tok_idx]));
                }

                /* check whether it was not already specified */
                for (i = 0; i < set->count; ++i) {
                    /* all the keys must be from the same module so this comparison should be fine */
                    if (!strncmp(set->objs[i], name, name_len) &&
                            lysp_check_identifierchar(NULL, ((char *)set->objs[i])[name_len], 0, NULL)) {
                        LOGVAL(ctx, LYVE_XPATH, "Duplicate predicate key \"%.*s\" in path.", (int)name_len, name);
                        goto token_error;
                    }
                }

                /* add it into the set */
                ret = ly_set_add(set, (void *)name, 1, NULL);
                LY_CHECK_GOTO(ret, cleanup);

                /* NameTest */
                ++(*tok_idx);

                /* '=' */
                LY_CHECK_GOTO(lyxp_next_token(ctx, exp, tok_idx, LYXP_TOKEN_OPER_EQUAL), token_error);

                /* fill repeat */
                exp->repeat[*tok_idx - 2] = calloc(2, sizeof *exp->repeat[*tok_idx]);
                LY_CHECK_ERR_GOTO(!exp->repeat[*tok_idx - 2], LOGMEM(NULL); ret = LY_EMEM, cleanup);
                exp->repeat[*tok_idx - 2][0] = LYXP_EXPR_EQUALITY;

                /* Literal, Number, or VariableReference */
                if (lyxp_next_token(NULL, exp, tok_idx, LYXP_TOKEN_LITERAL) &&
                        lyxp_next_token(NULL, exp, tok_idx, LYXP_TOKEN_NUMBER) &&
                        lyxp_next_token(NULL, exp, tok_idx, LYXP_TOKEN_VARREF)) {
                    /* error */
                    lyxp_next_token(ctx, exp, tok_idx, LYXP_TOKEN_LITERAL);
                    goto token_error;
                }

                /* ']' */
                LY_CHECK_GOTO(lyxp_next_token(ctx, exp, tok_idx, LYXP_TOKEN_BRACK2), token_error);

                /* '[' */
            } while (!lyxp_next_token(NULL, exp, tok_idx, LYXP_TOKEN_BRACK1));

        } else if ((pred == LY_PATH_PRED_SIMPLE) && !lyxp_next_token(NULL, exp, tok_idx, LYXP_TOKEN_DOT)) {
            /* '.' */

            /* '=' */
            LY_CHECK_GOTO(lyxp_next_token(ctx, exp, tok_idx, LYXP_TOKEN_OPER_EQUAL), token_error);

            /* fill repeat */
            exp->repeat[*tok_idx - 2] = calloc(2, sizeof *exp->repeat[*tok_idx]);
            LY_CHECK_ERR_GOTO(!exp->repeat[*tok_idx - 2], LOGMEM(NULL); ret = LY_EMEM, cleanup);
            exp->repeat[*tok_idx - 2][0] = LYXP_EXPR_EQUALITY;

            /* Literal or Number */
            LY_CHECK_GOTO(lyxp_next_token2(ctx, exp, tok_idx, LYXP_TOKEN_LITERAL, LYXP_TOKEN_NUMBER), token_error);

            /* ']' */
            LY_CHECK_GOTO(lyxp_next_token(ctx, exp, tok_idx, LYXP_TOKEN_BRACK2), token_error);

        } else if ((pred == LY_PATH_PRED_SIMPLE) && !lyxp_next_token(NULL, exp, tok_idx, LYXP_TOKEN_NUMBER)) {
            /* Number */

            /* check for index 0 */
            if (!atoi(exp->expr + exp->tok_pos[*tok_idx - 1])) {
                LOGVAL(ctx, LYVE_XPATH, "Invalid positional predicate \"%.*s\".", (int)exp->tok_len[*tok_idx - 1],
                        exp->expr + exp->tok_pos[*tok_idx - 1]);
                goto token_error;
            }

            /* ']' */
            LY_CHECK_GOTO(lyxp_next_token(ctx, exp, tok_idx, LYXP_TOKEN_BRACK2), token_error);

        } else if ((pred == LY_PATH_PRED_LEAFREF) && !lyxp_check_token(NULL, exp, *tok_idx, LYXP_TOKEN_NAMETEST)) {
            assert(prefix == LY_PATH_PREFIX_OPTIONAL);
            ret = ly_set_new(&set);
            LY_CHECK_GOTO(ret, cleanup);

            do {
                /* NameTest is always expected here */
                LY_CHECK_GOTO(lyxp_check_token(ctx, exp, *tok_idx, LYXP_TOKEN_NAMETEST), token_error);

                name = strnstr(exp->expr + exp->tok_pos[*tok_idx], ":", exp->tok_len[*tok_idx]);
                if (!name) {
                    name = exp->expr + exp->tok_pos[*tok_idx];
                    name_len = exp->tok_len[*tok_idx];
                } else {
                    ++name;
                    name_len = exp->tok_len[*tok_idx] - (name - (exp->expr + exp->tok_pos[*tok_idx]));
                }

                /* check whether it was not already specified */
                for (i = 0; i < set->count; ++i) {
                    /* all the keys must be from the same module so this comparison should be fine */
                    if (!strncmp(set->objs[i], name, name_len) &&
                            lysp_check_identifierchar(NULL, ((char *)set->objs[i])[name_len], 0, NULL)) {
                        LOGVAL(ctx, LYVE_XPATH, "Duplicate predicate key \"%.*s\" in path.", (int)name_len, name);
                        goto token_error;
                    }
                }

                /* add it into the set */
                ret = ly_set_add(set, (void *)name, 1, NULL);
                LY_CHECK_GOTO(ret, cleanup);

                /* NameTest */
                ++(*tok_idx);

                /* '=' */
                LY_CHECK_GOTO(lyxp_next_token(ctx, exp, tok_idx, LYXP_TOKEN_OPER_EQUAL), token_error);

                /* fill repeat */
                exp->repeat[*tok_idx - 2] = calloc(2, sizeof *exp->repeat[*tok_idx]);
                LY_CHECK_ERR_GOTO(!exp->repeat[*tok_idx - 2], LOGMEM(NULL); ret = LY_EMEM, cleanup);
                exp->repeat[*tok_idx - 2][0] = LYXP_EXPR_EQUALITY;

                /* FuncName */
                LY_CHECK_GOTO(lyxp_check_token(ctx, exp, *tok_idx, LYXP_TOKEN_FUNCNAME), token_error);
                if ((exp->tok_len[*tok_idx] != ly_strlen_const("current")) ||
                        strncmp(exp->expr + exp->tok_pos[*tok_idx], "current", ly_strlen_const("current"))) {
                    LOGVAL(ctx, LYVE_XPATH, "Invalid function \"%.*s\" invocation in path.",
                            (int)exp->tok_len[*tok_idx], exp->expr + exp->tok_pos[*tok_idx]);
                    goto token_error;
                }
                ++(*tok_idx);

                /* '(' */
                LY_CHECK_GOTO(lyxp_next_token(ctx, exp, tok_idx, LYXP_TOKEN_PAR1), token_error);

                /* ')' */
                LY_CHECK_GOTO(lyxp_next_token(ctx, exp, tok_idx, LYXP_TOKEN_PAR2), token_error);

                /* '/' */
                LY_CHECK_GOTO(lyxp_next_token(ctx, exp, tok_idx, LYXP_TOKEN_OPER_PATH), token_error);

                /* '..' */
                LY_CHECK_GOTO(lyxp_next_token(ctx, exp, tok_idx, LYXP_TOKEN_DDOT), token_error);
                do {
                    /* '/' */
                    LY_CHECK_GOTO(lyxp_next_token(ctx, exp, tok_idx, LYXP_TOKEN_OPER_PATH), token_error);
                } while (!lyxp_next_token(NULL, exp, tok_idx, LYXP_TOKEN_DDOT));

                /* NameTest */
                LY_CHECK_GOTO(lyxp_next_token(ctx, exp, tok_idx, LYXP_TOKEN_NAMETEST), token_error);

                /* '/' */
                while (!lyxp_next_token(NULL, exp, tok_idx, LYXP_TOKEN_OPER_PATH)) {
                    /* NameTest */
                    LY_CHECK_GOTO(lyxp_next_token(ctx, exp, tok_idx, LYXP_TOKEN_NAMETEST), token_error);
                }

                /* ']' */
                LY_CHECK_GOTO(lyxp_next_token(ctx, exp, tok_idx, LYXP_TOKEN_BRACK2), token_error);

                /* '[' */
            } while (!lyxp_next_token(NULL, exp, tok_idx, LYXP_TOKEN_BRACK1));

        } else if (lyxp_check_token(ctx, exp, *tok_idx, 0)) {
            /* unexpected EOF */
            goto token_error;
        } else {
            /* invalid token */
            LOGVAL(ctx, LY_VCODE_XP_INTOK, lyxp_token2str(exp->tokens[*tok_idx]), exp->expr + exp->tok_pos[*tok_idx]);
            goto token_error;
        }
    }

cleanup:
    LOG_LOCBACK(cur_node ? 1 : 0, 0);
    ly_set_free(set, NULL);
    return ret;

token_error:
    LOG_LOCBACK(cur_node ? 1 : 0, 0);
    ly_set_free(set, NULL);
    return LY_EVALID;
}